

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

QRect __thiscall QPolygon::boundingRect(QPolygon *this)

{
  int iVar1;
  long lVar2;
  QPoint *pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  QRect QVar11;
  
  lVar2 = (this->super_QList<QPoint>).d.size;
  if (lVar2 != 0) {
    pQVar3 = (this->super_QList<QPoint>).d.ptr;
    iVar5 = (pQVar3->xp).m_i;
    iVar6 = (pQVar3->yp).m_i;
    iVar7 = iVar5;
    iVar8 = iVar6;
    for (lVar9 = 0; lVar2 * 8 + -8 != lVar9; lVar9 = lVar9 + 8) {
      iVar10 = *(int *)((long)&pQVar3[1].xp.m_i + lVar9);
      iVar1 = *(int *)((long)&pQVar3[1].yp.m_i + lVar9);
      iVar4 = iVar7;
      if (iVar7 < iVar10) {
        iVar4 = iVar10;
      }
      if (iVar5 <= iVar10) {
        iVar7 = iVar4;
        iVar10 = iVar5;
      }
      iVar5 = iVar10;
      iVar10 = iVar8;
      if (iVar8 < iVar1) {
        iVar10 = iVar1;
      }
      if (iVar6 <= iVar1) {
        iVar1 = iVar6;
        iVar8 = iVar10;
      }
      iVar6 = iVar1;
    }
    QVar11.y1.m_i = iVar6;
    QVar11.x1.m_i = iVar5;
    QVar11.y2.m_i = iVar8;
    QVar11.x2.m_i = iVar7;
    return QVar11;
  }
  return (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }